

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

int __thiscall CPU::instrAND0x2d(CPU *this)

{
  uint8_t argument;
  
  argument = absolute_addr(this);
  AND(this,argument);
  return 4;
}

Assistant:

int CPU::instrAND0x2d() {
	AND(absolute_addr());
	return 4;
}